

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall
pbrt::ParsedScene::MakeNamedMaterial
          (ParsedScene *this,string *name,ParsedParameterVector *params,FileLoc loc)

{
  FileLoc loc_00;
  bool bVar1;
  __type _Var2;
  SceneEntity *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>
  *nm;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
  *__range1;
  ParameterDictionary dict;
  ParameterDictionary *in_stack_fffffffffffffc88;
  value_type *__x;
  ParameterDictionary *in_stack_fffffffffffffc90;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>
  *this_00;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_fffffffffffffc98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x_00;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_fffffffffffffca0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffca8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcb0;
  ParameterDictionary *parameters;
  string *name_00;
  char *__s;
  RGBColorSpace *in_stack_fffffffffffffcd8;
  ParsedParameterVector *in_stack_fffffffffffffce0;
  ParsedParameterVector *in_stack_fffffffffffffce8;
  ParameterDictionary *in_stack_fffffffffffffcf0;
  undefined1 local_299 [389];
  undefined4 local_114;
  reference local_110;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>
  *local_108;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>_>
  local_100;
  char **local_f8;
  string local_e0 [7];
  
  __s = &stack0x00000008;
  if (*(int *)(in_RDI + 0x43) == 2) {
    Error<char_const(&)[18]>((FileLoc *)in_RDI,__s,(char (*) [18])in_RDX);
  }
  else if (*(int *)(in_RDI + 0x43) == 0) {
    Error<char_const(&)[18]>((FileLoc *)in_RDI,__s,(char (*) [18])in_RDX);
  }
  else {
    name_00 = local_e0;
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::InlinedVector(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
    ParameterDictionary::ParameterDictionary
              (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
               in_stack_fffffffffffffcd8);
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::~InlinedVector(&in_stack_fffffffffffffc90->params);
    local_f8 = (char **)&in_RDI[0x39]._M_string_length;
    local_100._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>
          *)std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
            ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
                     *)in_stack_fffffffffffffc88);
    local_108 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>
                 *)std::
                   vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
                   ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
                          *)in_stack_fffffffffffffc88);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>_>
                          *)in_stack_fffffffffffffc90,
                         (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>_>
                          *)in_stack_fffffffffffffc88);
      if (!bVar1) break;
      local_110 = __gnu_cxx::
                  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>_>
                  ::operator*(&local_100);
      _Var2 = std::operator==(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
      if (_Var2) {
        SceneRepresentation::ErrorExitDeferred<std::__cxx11::string_const&>
                  ((SceneRepresentation *)in_stack_fffffffffffffca0,
                   (FileLoc *)in_stack_fffffffffffffc98,(char *)in_stack_fffffffffffffc90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc88);
        local_114 = 1;
        goto LAB_009d03c7;
      }
      __gnu_cxx::
      __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>_>
      ::operator++(&local_100);
    }
    parameters = (ParameterDictionary *)local_299;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(in_RDI,__s,(allocator<char> *)in_RDX);
    ParameterDictionary::ParameterDictionary(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    __x_00 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(__s + 0x10);
    __x = *(value_type **)__s;
    this_00 = *(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>
                **)(__s + 8);
    loc_00.filename._M_str = (char *)__x;
    loc_00.filename._M_len = (size_t)in_RDI;
    loc_00._16_8_ = this_00;
    SceneEntity::SceneEntity(in_RDX,name_00,parameters,loc_00);
    std::make_pair<std::__cxx11::string_const&,pbrt::SceneEntity>(__x_00,(SceneEntity *)this_00);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
    ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
                 *)this_00,__x);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>
    ::~pair(this_00);
    SceneEntity::~SceneEntity((SceneEntity *)this_00);
    ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x9d03a2);
    std::__cxx11::string::~string((string *)(local_299 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_299);
    local_114 = 0;
LAB_009d03c7:
    ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x9d03d4);
  }
  return;
}

Assistant:

void ParsedScene::MakeNamedMaterial(const std::string &name, ParsedParameterVector params,
                                    FileLoc loc) {
    VERIFY_WORLD("MakeNamedMaterial");

    ParameterDictionary dict(std::move(params), graphicsState->materialAttributes,
                             graphicsState->colorSpace);

    // Note: O(n). FIXME?
    for (const auto &nm : namedMaterials)
        if (nm.first == name) {
            ErrorExitDeferred(&loc, "%s: named material redefined.", name);
            return;
        }

    namedMaterials.push_back(std::make_pair(name, SceneEntity("", std::move(dict), loc)));
}